

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O0

EbmlElement * __thiscall libebml::EbmlMaster::FindNextElt(EbmlMaster *this,EbmlElement *PastElt)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  const_reference ppEVar5;
  undefined8 *puVar6;
  undefined4 extraout_var;
  EbmlId local_48;
  EbmlId local_38;
  ulong local_28;
  size_t Index;
  EbmlElement *PastElt_local;
  EbmlMaster *this_local;
  
  local_28 = 0;
  Index = (size_t)PastElt;
  PastElt_local = &this->super_EbmlElement;
  do {
    uVar1 = local_28;
    sVar4 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::size
                      (&this->ElementList);
    if (sVar4 <= uVar1) {
LAB_001bcbeb:
      while( true ) {
        uVar1 = local_28;
        sVar4 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::size
                          (&this->ElementList);
        if (sVar4 <= uVar1) {
          return (EbmlElement *)0x0;
        }
        puVar6 = (undefined8 *)(**(code **)(*(long *)Index + 0x18))();
        local_38._0_8_ = *puVar6;
        local_38.Length = puVar6[1];
        ppEVar5 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::
                  operator[](&this->ElementList,local_28);
        iVar3 = (*(*ppEVar5)->_vptr_EbmlElement[3])();
        local_48._0_8_ = *(undefined8 *)CONCAT44(extraout_var,iVar3);
        local_48.Length = ((undefined8 *)CONCAT44(extraout_var,iVar3))[1];
        bVar2 = EbmlId::operator==(&local_38,&local_48);
        if (bVar2) break;
        local_28 = local_28 + 1;
      }
      ppEVar5 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::
                operator[](&this->ElementList,local_28);
      return *ppEVar5;
    }
    ppEVar5 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::
              operator[](&this->ElementList,local_28);
    if (*ppEVar5 == (value_type)Index) {
      local_28 = local_28 + 1;
      goto LAB_001bcbeb;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

EbmlElement *EbmlMaster::FindNextElt(const EbmlElement & PastElt) const
{
  size_t Index;

  for (Index = 0; Index < ElementList.size(); Index++) {
    if ((ElementList[Index]) == &PastElt) {
      // found past element, new one is :
      Index++;
      break;
    }
  }

  while (Index < ElementList.size()) {
    if ((EbmlId)PastElt == (EbmlId)(*ElementList[Index]))
      return ElementList[Index];
    Index++;
  }

  return NULL;
}